

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

EGLContext
deqp::egl::anon_unknown_0::anon_unknown_5::createEGLContext
          (EglTestContext *testCtx,EGLDisplay eglDisplay,EGLConfig eglConfig,EGLContext share)

{
  deUint32 dVar1;
  deBool dVar2;
  EGLContext pvVar3;
  EGLContext context;
  EGLint attribList [3];
  Library *egl;
  EGLContext share_local;
  EGLConfig eglConfig_local;
  EGLDisplay eglDisplay_local;
  EglTestContext *testCtx_local;
  
  attribList._4_8_ = EglTestContext::getLibrary(testCtx);
  stack0xffffffffffffffc4 = 0x200003098;
  attribList[0] = 0x3038;
  do {
    (*(code *)**(undefined8 **)attribList._4_8_)(attribList._4_8_,0x30a0);
    dVar1 = (**(code **)(*(long *)attribList._4_8_ + 0xf8))();
    eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                     ,0x1c5);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  pvVar3 = (EGLContext)
           (**(code **)(*(long *)attribList._4_8_ + 0x30))
                     (attribList._4_8_,eglDisplay,eglConfig,share,(long)&context + 4);
  dVar1 = (**(code **)(*(long *)attribList._4_8_ + 0xf8))();
  eglu::checkError(dVar1,"eglCreateContext()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                   ,0x1c8);
  return pvVar3;
}

Assistant:

EGLContext createEGLContext (EglTestContext& testCtx, EGLDisplay eglDisplay, EGLConfig eglConfig, EGLContext share)
{
	const Library&	egl				= testCtx.getLibrary();
	const EGLint	attribList[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));

	EGLContext context = egl.createContext(eglDisplay, eglConfig, share, attribList);
	EGLU_CHECK_MSG(egl, "eglCreateContext()");

	return context;
}